

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall wabt::interp::Thread::DoThrow(Thread *this,Ptr *exn)

{
  pointer *ppFVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  u32 uVar5;
  pointer pFVar6;
  size_t sVar7;
  size_t sVar8;
  iterator __position;
  Module *pMVar9;
  bool bVar10;
  ulong extraout_RAX;
  Ref ref;
  bool bVar11;
  pointer pHVar12;
  pointer pHVar13;
  pointer pCVar14;
  bool bVar15;
  vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> handlers;
  u32 local_e4;
  RunResult local_d4;
  ulong local_c8;
  ulong local_c0;
  RefPtr<wabt::interp::DefinedFunc> local_a0;
  pointer local_88;
  pointer local_80;
  RefPtr<wabt::interp::Tag> local_78;
  vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> local_60;
  RefPtr<wabt::interp::Tag> local_48;
  
  RefPtr<wabt::interp::Tag>::RefPtr(&local_78,this->store_,(Ref)(exn->obj_->tag_).index);
  local_e4 = 0xffffffff;
  bVar3 = 0;
  bVar11 = false;
  bVar10 = false;
  local_c8 = extraout_RAX;
  local_c0 = extraout_RAX;
  do {
    pFVar6 = (this->frames_).
             super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_d4 = Exception;
    if ((this->frames_).
        super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
        super__Vector_impl_data._M_start == pFVar6) goto LAB_001b7d43;
    RefPtr<wabt::interp::DefinedFunc>::RefPtr(&local_a0,this->store_,(Ref)pFVar6[-1].func.index);
    uVar4 = pFVar6[-1].offset;
    std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::vector
              (&local_60,&((local_a0.obj_)->desc_).handlers);
    pHVar13 = local_60.
              super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_60.
        super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_60.
        super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      do {
        pHVar12 = pHVar13 + -1;
        if ((pHVar13[-1].try_start_offset < uVar4) && (uVar4 <= pHVar13[-1].try_end_offset)) {
          if (pHVar12->kind == Delegate) {
            pHVar12 = local_60.
                      super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start +
                      (ulong)pHVar13[-1].field_4.catch_all_offset + 1;
          }
          else {
            pCVar14 = pHVar13[-1].catches.
                      super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_80 = pHVar13[-1].catches.
                       super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            local_88 = pHVar12;
            if (pCVar14 != local_80) {
              do {
                uVar5 = pCVar14->offset;
                bVar2 = pCVar14->ref;
                RefPtr<wabt::interp::Tag>::RefPtr
                          (&local_48,this->store_,
                           (Ref)((pFVar6[-1].inst)->tags_).
                                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                ._M_impl.super__Vector_impl_data._M_start[pCVar14->tag_index].index)
                ;
                sVar7 = ((local_78.obj_)->super_Extern).super_Object.self_.index;
                sVar8 = ((local_48.obj_)->super_Extern).super_Object.self_.index;
                bVar15 = sVar7 == sVar8;
                if (bVar15) {
                  local_c8 = (ulong)pHVar13[-1].values;
                  local_c0 = (ulong)pHVar13[-1].exceptions;
                  local_e4 = uVar5;
                  bVar3 = bVar2;
                }
                Store::DeleteRoot(local_48.store_,local_48.root_index_);
                if (sVar7 == sVar8) goto LAB_001b7c18;
                pCVar14 = pCVar14 + 1;
              } while (pCVar14 != local_80);
            }
            pHVar12 = local_88;
            if (pHVar13[-1].field_4.catch_all_offset != 0xffffffff) {
              local_c8 = (ulong)pHVar13[-1].values;
              local_c0 = (ulong)pHVar13[-1].exceptions;
              bVar3 = pHVar13[-1].catch_all_ref;
              bVar11 = true;
              bVar15 = true;
              local_e4 = pHVar13[-1].field_4.catch_all_offset;
              goto LAB_001b7c18;
            }
          }
        }
        pHVar13 = pHVar12;
      } while (pHVar12 !=
               local_60.
               super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
               ._M_impl.super__Vector_impl_data._M_start);
    }
    ppFVar1 = &(this->frames_).
               super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl
               .super__Vector_impl_data._M_finish;
    *ppFVar1 = *ppFVar1 + -1;
    bVar10 = true;
    bVar15 = false;
LAB_001b7c18:
    std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::~vector
              (&local_60);
    if (local_a0.obj_ != (DefinedFunc *)0x0) {
      Store::DeleteRoot(local_a0.store_,local_a0.root_index_);
    }
  } while (!bVar15);
  if (bVar15) {
    if (local_e4 == 0xffffffff) {
      __assert_fail("target_offset != Istream::kInvalidOffset",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp.cc"
                    ,0xa96,"RunResult wabt::interp::Thread::DoThrow(Exception::Ptr)");
    }
    pFVar6 = (this->frames_).
             super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (bVar10) {
      pMVar9 = pFVar6[-1].mod;
      this->inst_ = pFVar6[-1].inst;
      this->mod_ = pMVar9;
    }
    std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::resize
              (&this->values_,(ulong)((int)local_c8 + pFVar6[-1].values));
    std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::resize
              (&this->exceptions_,(ulong)((int)local_c0 + pFVar6[-1].exceptions));
    pFVar6[-1].offset = local_e4;
    local_a0.obj_ = (DefinedFunc *)RefPtr<wabt::interp::Exception>::ref(exn);
    __position._M_current =
         (this->exceptions_).
         super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->exceptions_).
        super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
      _M_realloc_insert<wabt::interp::Ref>(&this->exceptions_,__position,(Ref *)&local_a0);
    }
    else {
      (__position._M_current)->index = (size_t)local_a0.obj_;
      (this->exceptions_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
      _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    if (!bVar11) {
      PushValues(this,&((local_78.obj_)->type_).signature,&exn->obj_->args_);
    }
    local_d4 = Ok;
    if ((bVar3 & 1) != 0) {
      ref = RefPtr<wabt::interp::Exception>::ref(exn);
      Push(this,ref);
    }
  }
LAB_001b7d43:
  if (local_78.obj_ != (Tag *)0x0) {
    Store::DeleteRoot(local_78.store_,local_78.root_index_);
  }
  return local_d4;
}

Assistant:

RunResult Thread::DoThrow(Exception::Ptr exn) {
  Istream::Offset target_offset = Istream::kInvalidOffset;
  u32 target_values, target_exceptions;
  Tag::Ptr exn_tag{store_, exn->tag()};
  bool popped_frame = false;
  bool had_catch_all = false;
  bool target_exnref = false;

  // DoThrow is responsible for unwinding the stack at the point at which an
  // exception is thrown, and also branching to the appropriate catch within
  // the target try-catch. In a compiler, the tag dispatch might be done in
  // generated code in a landing pad, but this is easier for the interpreter.
  while (!frames_.empty()) {
    const Frame& frame = frames_.back();
    DefinedFunc::Ptr func{store_, frame.func};
    u32 pc = frame.offset;
    auto handlers = func->desc().handlers;

    // We iterate in reverse order, in order to traverse handlers from most
    // specific (pushed last) to least specific within a nested stack of
    // try-catch blocks.
    auto iter = handlers.rbegin();
    while (iter != handlers.rend()) {
      const HandlerDesc& handler = *iter;
      // pc points to the *next* instruction by the time we're in DoThrow.
      if (pc > handler.try_start_offset && pc <= handler.try_end_offset) {
        // For a try-delegate, skip part of the traversal by directly going
        // up to an outer handler specified by the delegate depth.
        if (handler.kind == HandlerKind::Delegate) {
          // Subtract one as we're trying to get a reverse iterator that is
          // offset by `delegate_handler_index` from the first item.
          iter = handlers.rend() - handler.delegate_handler_index - 1;
          continue;
        }
        // Otherwise, check for a matching catch tag or catch_all.
        for (auto _catch : handler.catches) {
          // Here we have to be careful to use the target frame's instance
          // to look up the tag rather than the throw's instance.
          Ref catch_tag_ref = frame.inst->tags()[_catch.tag_index];
          Tag::Ptr catch_tag{store_, catch_tag_ref};
          if (exn_tag == catch_tag) {
            target_offset = _catch.offset;
            target_values = (*iter).values;
            target_exceptions = (*iter).exceptions;
            target_exnref = _catch.ref;
            goto found_handler;
          }
        }
        if (handler.catch_all_offset != Istream::kInvalidOffset) {
          target_offset = handler.catch_all_offset;
          target_values = (*iter).values;
          target_exceptions = (*iter).exceptions;
          had_catch_all = true;
          target_exnref = handler.catch_all_ref;
          goto found_handler;
        }
      }
      iter++;
    }
    frames_.pop_back();
    popped_frame = true;
  }

  // If the call frames are empty now, the exception is uncaught.
  assert(frames_.empty());
  return RunResult::Exception;

found_handler:
  assert(target_offset != Istream::kInvalidOffset);

  Frame& target_frame = frames_.back();
  // If the throw crosses call frames, we need to reset the state to that
  // call frame's values. The stack heights may need to be offset by the
  // handler's heights as we may be jumping into the middle of the function
  // code after some stack height changes.
  if (popped_frame) {
    inst_ = target_frame.inst;
    mod_ = target_frame.mod;
  }
  values_.resize(target_frame.values + target_values);
  exceptions_.resize(target_frame.exceptions + target_exceptions);
  // Jump to the handler.
  target_frame.offset = target_offset;
  // When an exception is caught, it needs to be tracked in a stack
  // to allow for rethrows. This stack is popped on leaving the try-catch
  // or by control instructions such as `br`.
  exceptions_.push_back(exn.ref());
  // Also push exception payload values if applicable.
  if (!had_catch_all) {
    PushValues(exn_tag->type().signature, exn->args());
  }
  if (target_exnref) {
    Push(exn.ref());
  }
  return RunResult::Ok;
}